

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O2

Aig_Man_t *
Aig_ManFraigPartitioned(Aig_Man_t *pAig,int nPartSize,int nConfMax,int nLevelMax,int fVerbose)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Vec_Ptr_t *p;
  Vec_Int_t *vPart;
  Aig_Man_t *pAVar7;
  void *__ptr;
  void *pvVar8;
  Aig_Man_t *p_00;
  Vec_Ptr_t *p_01;
  int i;
  long lVar9;
  ulong uVar10;
  
  p = Aig_ManPartitionNaive(pAig,nPartSize);
  Aig_ManReprStart(pAig,pAig->vObjs->nSize);
  Aig_ManSetCioIds(pAig);
  uVar1 = p->nSize;
  for (i = 0; i < (int)uVar1; i = i + 1) {
    vPart = (Vec_Int_t *)Vec_PtrEntry(p,i);
    pAVar7 = Aig_ManDupPartAll(pAig,vPart);
    p_01 = pAVar7->vObjs;
    uVar10 = (ulong)p_01->nSize;
    __ptr = malloc(uVar10 << 3);
    for (lVar9 = 0; lVar9 < (int)uVar10; lVar9 = lVar9 + 1) {
      pvVar8 = Vec_PtrEntry(p_01,(int)lVar9);
      if (pvVar8 != (void *)0x0) {
        *(undefined8 *)((long)__ptr + lVar9 * 8) = *(undefined8 *)((long)pvVar8 + 0x28);
      }
      p_01 = pAVar7->vObjs;
      uVar10 = (ulong)(uint)p_01->nSize;
    }
    if (fVerbose != 0) {
      uVar2 = pAVar7->nObjs[2];
      uVar3 = pAVar7->nObjs[3];
      iVar4 = pAVar7->nObjs[6];
      iVar5 = pAVar7->nObjs[5];
      iVar6 = Aig_ManLevelNum(pAVar7);
      printf("Part %4d  (out of %4d)  PI = %5d. PO = %5d. And = %6d. Lev = %4d.\r",(ulong)(i + 1),
             (ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)(uint)(iVar4 + iVar5),iVar6);
    }
    p_00 = Fra_FraigChoice(pAVar7,nConfMax,nLevelMax);
    Aig_ManStop(p_00);
    for (lVar9 = 0; lVar9 < pAVar7->vObjs->nSize; lVar9 = lVar9 + 1) {
      pvVar8 = Vec_PtrEntry(pAVar7->vObjs,(int)lVar9);
      if (pvVar8 != (void *)0x0) {
        *(undefined8 *)((long)pvVar8 + 0x28) = *(undefined8 *)((long)__ptr + lVar9 * 8);
      }
    }
    free(__ptr);
    if (pAVar7->pReprs != (Aig_Obj_t **)0x0) {
      Aig_ManTransferRepr(pAig,pAVar7);
    }
    Aig_ManStop(pAVar7);
  }
  if (fVerbose != 0) {
    printf(
          "                                                                                          \r"
          );
  }
  Vec_VecFree((Vec_Vec_t *)p);
  Aig_ManCleanCioIds(pAig);
  pAVar7 = Aig_ManDupRepr(pAig,0);
  return pAVar7;
}

Assistant:

Aig_Man_t * Aig_ManFraigPartitioned( Aig_Man_t * pAig, int nPartSize, int nConfMax, int nLevelMax, int fVerbose )
{
//    extern Aig_Man_t * Fra_FraigChoice( Aig_Man_t * pManAig, int nConfMax, int nLevelMax );

    Aig_Man_t * pAigPart, * pAigTemp;
    Vec_Int_t * vPart;
    Vec_Ptr_t * vParts;
    Aig_Obj_t * pObj;
    void ** ppData;
    int i, k;

    // partition the outputs of the AIG
    vParts = Aig_ManPartitionNaive( pAig, nPartSize );

    // start the equivalence classes
    Aig_ManReprStart( pAig, Aig_ManObjNumMax(pAig) );

    // set the PI numbers
    Aig_ManSetCioIds( pAig );

    // create the total fraiged AIG
    Vec_PtrForEachEntry( Vec_Int_t *, vParts, vPart, i )
    {
        // derive the partition AIG
        pAigPart = Aig_ManDupPartAll( pAig, vPart );
        // store contents of pData pointers
        ppData = ABC_ALLOC( void *, Aig_ManObjNumMax(pAigPart) );
        Aig_ManForEachObj( pAigPart, pObj, k )
            ppData[k] = pObj->pData;
        // report the process
        if ( fVerbose )
        printf( "Part %4d  (out of %4d)  PI = %5d. PO = %5d. And = %6d. Lev = %4d.\r", 
            i+1, Vec_PtrSize(vParts), Aig_ManCiNum(pAigPart), Aig_ManCoNum(pAigPart), 
            Aig_ManNodeNum(pAigPart), Aig_ManLevelNum(pAigPart) );
        // compute equivalence classes (to be stored in pNew->pReprs)
        pAigTemp = Fra_FraigChoice( pAigPart, nConfMax, nLevelMax );
        Aig_ManStop( pAigTemp );
        // reset the pData pointers
        Aig_ManForEachObj( pAigPart, pObj, k )
            pObj->pData = ppData[k];
        ABC_FREE( ppData );
        // transfer representatives to the total AIG
        if ( pAigPart->pReprs )
            Aig_ManTransferRepr( pAig, pAigPart );
        Aig_ManStop( pAigPart );
    }
    if ( fVerbose )
    printf( "                                                                                          \r" );
    Vec_VecFree( (Vec_Vec_t *)vParts );

    // clear the PI numbers
    Aig_ManCleanCioIds( pAig );

    // derive the result of choicing
    return Aig_ManDupRepr( pAig, 0 );
}